

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LAJIVM.cpp
# Opt level: O1

int main(int argc,char **argv)

{
  char *pcVar1;
  char *pcVar2;
  char cVar3;
  int iVar4;
  istream *piVar5;
  long lVar6;
  string r_str;
  string str;
  string temp;
  allocator local_f1;
  undefined1 *local_f0;
  char *local_e8;
  undefined1 local_e0;
  undefined7 uStack_df;
  char *local_d0;
  undefined8 local_c8;
  char local_c0;
  undefined7 uStack_bf;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_b0 [2];
  size_type local_a0 [2];
  string local_90;
  string local_70;
  string local_50;
  
  local_c8 = 0;
  local_c0 = '\0';
  local_e8 = (char *)0x0;
  local_e0 = 0;
  local_f0 = &local_e0;
  local_d0 = &local_c0;
  init_all();
  pcVar2 = local_e8;
  if (argc == 3) {
    std::__cxx11::string::string((string *)local_b0,argv[1],&local_f1);
    iVar4 = std::__cxx11::string::compare((char *)local_b0);
    pcVar2 = local_e8;
    if (iVar4 == 0) {
      is_debug = true;
      pcVar1 = argv[2];
      strlen(pcVar1);
      std::__cxx11::string::_M_replace((ulong)&local_f0,0,pcVar2,(ulong)pcVar1);
      local_70._M_dataplus._M_p = (pointer)&local_70.field_2;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&local_70,local_f0,local_e8 + (long)local_f0);
      iVar4 = doit(&local_70);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_70._M_dataplus._M_p != &local_70.field_2) {
        operator_delete(local_70._M_dataplus._M_p,local_70.field_2._M_allocated_capacity + 1);
      }
    }
    else {
      puts(&DAT_0010714b);
      iVar4 = 1;
    }
    if (local_b0[0] ==
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_a0) goto LAB_001048eb;
  }
  else if (argc == 2) {
    pcVar1 = argv[1];
    strlen(pcVar1);
    std::__cxx11::string::_M_replace((ulong)&local_f0,0,pcVar2,(ulong)pcVar1);
    local_50._M_dataplus._M_p = (pointer)&local_50.field_2;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_50,local_f0,local_e8 + (long)local_f0);
    iVar4 = doit(&local_50);
    local_a0[0] = local_50.field_2._M_allocated_capacity;
    local_b0[0] = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_50._M_dataplus._M_p;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_50._M_dataplus._M_p == &local_50.field_2) goto LAB_001048eb;
  }
  else {
    puts(&DAT_001070fe);
    cVar3 = std::ios::widen((char)*(undefined8 *)(std::cin + -0x18) + -0x10);
    piVar5 = std::getline<char,std::char_traits<char>,std::allocator<char>>
                       ((istream *)&std::cin,(string *)&local_d0,cVar3);
    if (((byte)piVar5[*(long *)(*(long *)piVar5 + -0x18) + 0x20] & 5) != 0) {
      exit(0);
    }
    if (*local_d0 == 'd') {
      lVar6 = std::__cxx11::string::find((char)&local_d0,0x20);
      if (lVar6 == -1) {
        std::__cxx11::string::_M_assign((string *)&local_f0);
      }
      else {
        std::__cxx11::string::substr((ulong)local_b0,(ulong)&local_d0);
        std::__cxx11::string::operator=((string *)&local_f0,(string *)local_b0);
        if (local_b0[0] !=
            (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_a0) {
          operator_delete(local_b0[0],local_a0[0] + 1);
        }
        is_debug = true;
      }
    }
    else {
      std::__cxx11::string::_M_assign((string *)&local_f0);
    }
    local_90._M_dataplus._M_p = (pointer)&local_90.field_2;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_90,local_f0,local_e8 + (long)local_f0);
    iVar4 = doit(&local_90);
    local_a0[0] = local_90.field_2._M_allocated_capacity;
    local_b0[0] = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_90._M_dataplus._M_p;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_90._M_dataplus._M_p == &local_90.field_2) goto LAB_001048eb;
  }
  operator_delete(local_b0[0],local_a0[0] + 1);
LAB_001048eb:
  if (local_f0 != &local_e0) {
    operator_delete(local_f0,CONCAT71(uStack_df,local_e0) + 1);
  }
  if (local_d0 != &local_c0) {
    operator_delete(local_d0,CONCAT71(uStack_bf,local_c0) + 1);
  }
  return iVar4;
}

Assistant:

int main(int argc, char **argv) {
	std::string str;
	std::string r_str;
	try { init_all(); }
	catch (int e) {
		printf("初始化失败 %08X\n",e);
		return -1;
	}
	if (argc == 2) {
		r_str = argv[1];
        return  doit(r_str);
	}else if(argc == 3)
	{
		std::string temp = argv[1];
		if (temp == "d") {
			is_debug = true;
			r_str = argv[2];
            return doit(r_str);
		}else{
			printf("命令行参数错误\n");
            return 1;
		}
	}

	printf("虚拟机初始化完成请输入二进制文件路径,输入ctrl+z退出：\n");
	if (!std::getline(std::cin,str)) exit(0);
	if (*str.begin() == 'd') {
		auto temp = str.find(' ', 1);
		if (temp != std::string::npos) {
			r_str = str.substr(temp + 1);
			is_debug = true;
		}
		else r_str = str;
	}
	else r_str = str;
    return doit(r_str);
}